

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaders.h
# Opt level: O1

vec4f * __thiscall
GouraudShader::vertex
          (vec4f *__return_storage_ptr__,GouraudShader *this,Model *model,int iface,int nthvert)

{
  double dVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  size_t i;
  size_t nthvert_00;
  bool bVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double ret_2;
  undefined4 uVar9;
  undefined4 uVar10;
  vec4f gl_Vertex;
  vec<4UL,_double> ret_1;
  vec<4UL,_double> ret_3;
  double local_108 [4];
  vec<3UL,_double> local_e8;
  double dStack_d0;
  vec4f *local_c8;
  Model *local_c0;
  mat<4UL,_4UL> local_b8;
  
  nthvert_00 = (size_t)nthvert;
  local_c8 = __return_storage_ptr__;
  local_c0 = model;
  Model::vert((vec3f *)&local_b8,model,(long)iface,nthvert_00);
  local_108[2] = 0.0;
  local_108[3] = 0.0;
  local_108[0] = 0.0;
  local_108[1] = 0.0;
  i = 3;
  do {
    uVar9 = 0x3ff00000;
    uVar7 = 0;
    if (i + 1 < 4) {
      dVar1 = vec<3UL,_double>::operator[]((vec3f *)&local_b8,i);
      uVar7 = SUB84(dVar1,0);
      uVar9 = (undefined4)((ulong)dVar1 >> 0x20);
    }
    local_108[i] = (double)CONCAT44(uVar9,uVar7);
    bVar6 = i != 0;
    i = i - 1;
  } while (bVar6);
  operator*(&local_b8,&(this->super_IShader).uniform_Projection,
            &(this->super_IShader).uniform_ModelView);
  local_e8.z = 0.0;
  dStack_d0 = 0.0;
  local_e8.x = 0.0;
  local_e8.y = 0.0;
  lVar2 = 4;
  pdVar3 = local_b8.rows[3].data + 3;
  do {
    lVar2 = lVar2 + -1;
    dVar1 = 0.0;
    lVar5 = 0;
    do {
      dVar1 = dVar1 + pdVar3[lVar5] * local_108[lVar5 + 3];
      lVar5 = lVar5 + -1;
    } while (lVar5 != -4);
    *(double *)((long)&local_e8 + lVar2 * 8) = dVar1;
    pdVar3 = pdVar3 + -4;
  } while (lVar2 != 0);
  local_108[2] = local_e8.z;
  local_108[3] = dStack_d0;
  local_108[0] = local_e8.x;
  local_108[1] = local_e8.y;
  local_b8.rows[0].data[2] = local_e8.z;
  local_b8.rows[0].data[3] = dStack_d0;
  local_b8.rows[0].data[0] = local_e8.x;
  local_b8.rows[0].data[1] = local_e8.y;
  lVar2 = 3;
  do {
    local_b8.rows[0].data[lVar2] = local_b8.rows[0].data[lVar2] / dStack_d0;
    bVar6 = lVar2 != 0;
    lVar2 = lVar2 + -1;
  } while (bVar6);
  local_e8.x = 0.0;
  local_e8.y = 0.0;
  local_e8.z = 0.0;
  lVar2 = 3;
  do {
    lVar5 = (ulong)(lVar2 != 2) * 8 + 8;
    if (lVar2 == 1) {
      lVar5 = 0;
    }
    *(double *)((long)&local_e8.x + lVar5) = local_b8.rows[0].data[lVar2 + -1];
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  mat<3UL,_3UL>::set_col(&this->varying_tri,nthvert_00,&local_e8);
  Model::normal((vec3f *)&local_b8,local_c0,(long)iface,nthvert_00);
  dVar1 = dot<3ul,double>((vec3f *)&local_b8,&this->uniform_light_dir);
  if ((uint)nthvert < 3) {
    uVar7 = 0;
    uVar9 = 0;
    if (0.0 <= dVar1) {
      uVar7 = SUB84(dVar1,0);
      uVar9 = (undefined4)((ulong)dVar1 >> 0x20);
    }
    uVar8 = 0;
    uVar10 = 0x3ff00000;
    if ((double)CONCAT44(uVar9,uVar7) <= 1.0) {
      uVar8 = uVar7;
      uVar10 = uVar9;
    }
    lVar2 = 0;
    if (nthvert != 0) {
      lVar2 = (ulong)(nthvert != 1) * 8 + 8;
    }
    *(ulong *)((long)&(&this->varying_tri)[1].rows[0].x + lVar2) = CONCAT44(uVar10,uVar8);
    local_b8.rows[0].data[2] = 0.0;
    local_b8.rows[0].data[3] = 0.0;
    local_b8.rows[0].data[0] = 0.0;
    local_b8.rows[0].data[1] = 0.0;
    pdVar3 = (this->super_IShader).uniform_Viewport.rows[3].data + 3;
    lVar2 = 4;
    do {
      lVar5 = lVar2 + -1;
      lVar4 = 0;
      dVar1 = 0.0;
      do {
        dVar1 = dVar1 + pdVar3[lVar4] * local_108[lVar4 + 3];
        lVar4 = lVar4 + -1;
      } while (lVar4 != -4);
      local_b8.rows[0].data[lVar2 + -1] = dVar1;
      dVar1 = local_b8.rows[0].data[3];
      pdVar3 = pdVar3 + -4;
      lVar2 = lVar5;
    } while (lVar5 != 0);
    local_108[2] = local_b8.rows[0].data[2];
    local_108[3] = local_b8.rows[0].data[3];
    local_108[0] = local_b8.rows[0].data[0];
    local_108[1] = local_b8.rows[0].data[1];
    lVar2 = 3;
    do {
      local_b8.rows[0].data[lVar2] = local_b8.rows[0].data[lVar2] / dVar1;
      bVar6 = lVar2 != 0;
      lVar2 = lVar2 + -1;
    } while (bVar6);
    local_c8->data[2] = local_b8.rows[0].data[2];
    local_c8->data[3] = local_b8.rows[0].data[3];
    local_c8->data[0] = local_b8.rows[0].data[0];
    local_c8->data[1] = local_b8.rows[0].data[1];
    return local_c8;
  }
  __assert_fail("i >= 0 && i < 3",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cdgiessen[P]TinyRenderer/ext/geometry.h"
                ,0x8c,"T &vec<3>::operator[](const size_t) [n = 3, T = double]");
}

Assistant:

virtual vec4f vertex(Model& model, int iface, int nthvert)
    {
        vec4f gl_Vertex = embed<4>(model.vert(iface, nthvert));
        gl_Vertex = uniform_Projection * uniform_ModelView * gl_Vertex;
        varying_tri.set_col(nthvert, proj<3>(gl_Vertex / gl_Vertex[3]));

        varying_ity[nthvert] = clamp(dot(model.normal(iface, nthvert), uniform_light_dir), 0., 1.);

        gl_Vertex = uniform_Viewport * gl_Vertex;
        return proj<4>(gl_Vertex / gl_Vertex[3]);
    }